

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O0

void __thiscall mjs::reference::reference(reference *this,object_ptr *base,string *property_name)

{
  string *property_name_local;
  object_ptr *base_local;
  reference *this_local;
  
  gc_heap_ptr<mjs::object>::gc_heap_ptr(&this->base_,base);
  string::string(&this->property_name_,property_name);
  return;
}

Assistant:

explicit reference(const object_ptr& base, const string& property_name) : base_(base), property_name_(property_name) {
    }